

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  undefined1 *puVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  cmake *this_00;
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  *pmVar5;
  cmLinkedTree<cmState::SnapshotDataType> *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  cmState *pcVar13;
  cmState *extraout_RAX;
  undefined4 extraout_var_00;
  char *pcVar14;
  cmState *pcVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  long *plVar16;
  undefined8 uVar17;
  cmState *extraout_RAX_00;
  cmState *extraout_RAX_01;
  cmState *extraout_RAX_02;
  cmState *extraout_RAX_03;
  size_t sVar18;
  ostream *poVar19;
  undefined7 in_register_00000009;
  ulong *puVar20;
  cmState *pcVar21;
  cmState *pcVar22;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  cmState *pcVar23;
  cmListFileContext lfc;
  string result;
  t_lookup lookup;
  stack<t_lookup,_std::deque<t_lookup,_std::allocator<t_lookup>_>_> openstack;
  ostringstream ostr;
  cmOutputConverter converter;
  MessageType local_3d4;
  undefined1 local_3d0 [35];
  allocator local_3ad;
  allocator local_3ac;
  allocator local_3ab;
  allocator local_3aa;
  allocator local_3a9;
  undefined1 local_3a8 [32];
  _Alloc_hider local_388;
  size_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Base_ptr local_368;
  cmState *local_360;
  _Base_ptr local_358;
  cmLinkedTree<cmState::SnapshotDataType> *local_350;
  undefined1 local_348 [16];
  cmState *local_338;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_330;
  undefined1 local_328 [32];
  _Deque_base<t_lookup,_std::allocator<t_lookup>_> local_308;
  undefined4 local_2b8;
  undefined4 local_2b4;
  string *local_2b0;
  Snapshot *local_2a8;
  undefined1 local_2a0 [32];
  cmake *local_280;
  RegularExpression *local_278;
  cmState *local_270;
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  pointer local_218 [2];
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [360];
  cmOutputConverter local_50;
  
  local_2b8 = CONCAT31(in_register_00000089,atOnly);
  local_2b4 = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_328._20_4_ = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pcVar22 = (cmState *)(source->_M_dataplus)._M_p;
  local_358 = (_Base_ptr)local_348;
  local_350 = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_348[0] = _S_red;
  local_2b0 = source;
  std::__cxx11::string::reserve((ulong)&local_358);
  local_308._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<t_lookup,_std::allocator<t_lookup>_>::_M_initialize_map(&local_308,0);
  local_1c8._0_8_ = (ulong)(uint)local_1c8._4_4_ << 0x20;
  local_1c8._8_8_ = 0;
  if (local_308._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (_Elt_pointer)
      &((_Base_ptr)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_last + -0x20))->
       _M_left) {
    std::deque<t_lookup,_std::allocator<t_lookup>_>::_M_push_back_aux<t_lookup>
              ((deque<t_lookup,_std::allocator<t_lookup>_> *)&local_308,(t_lookup *)local_1c8);
  }
  else {
    *(undefined8 *)
     &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
         *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t)._M_impl =
         local_1c8._0_8_;
    *(cmLinkedTree<cmState::SnapshotDataType> **)
     &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
         *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t)._M_impl.
      super__Rb_tree_header._M_header = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
    local_308._M_impl.super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)
         &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
             *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t)._M_impl.
          super__Rb_tree_header._M_header._M_parent;
  }
  local_328._24_8_ = line;
  local_270 = this->LocalGenerator->GlobalGenerator->CMakeInstance->State;
  local_278 = &this->cmNamedCurly;
  pcVar15 = (cmState *)&this->StateSnapshot;
  local_3d4 = LOG;
  local_2a8 = (Snapshot *)0x0;
  local_360 = (cmState *)0x0;
  pcVar21 = pcVar22;
  local_280 = (cmake *)pcVar15;
  do {
    bVar2 = *(byte *)&(pcVar22->PropertyDefinitions)._M_t._M_impl;
    pcVar13 = pcVar21;
    if (bVar2 < 0x40) {
      if (bVar2 == 0) {
        local_2a8 = (Snapshot *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
        pcVar15 = (cmState *)local_2a8;
      }
      else if (bVar2 == 10) {
        local_328._24_8_ = (long)(_Rb_tree_color *)local_328._24_8_ + 1;
      }
      else {
        if (bVar2 != 0x24) goto LAB_0036bbfe;
        if ((char)local_2b8 != '\0') goto LAB_0036ba0b;
        uVar4 = (ulong)local_338 >> 0x20;
        local_338 = (cmState *)(uVar4 << 0x20);
        pcStack_330 = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
        pcVar13 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
        cVar3 = (pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
        pcVar15 = (cmState *)0x0;
        if (cVar3 == '\0') {
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          pcVar23 = (cmState *)0x0;
        }
        else if (cVar3 == '<') {
LAB_0036c5bb:
          pcVar23 = (cmState *)0x0;
          pcVar13 = pcVar21;
        }
        else if (cVar3 == '{') {
          pcVar23 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x2;
          local_338 = (cmState *)(uVar4 << 0x20);
          pcVar13 = pcVar21;
        }
        else {
          iVar11 = strncmp((char *)pcVar13,"ENV{",4);
          pcVar15 = (cmState *)CONCAT44(extraout_var_01,iVar11);
          if (iVar11 == 0) {
            pcVar23 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x5;
            local_338 = (cmState *)CONCAT44(local_338._4_4_,1);
            pcVar13 = pcVar21;
          }
          else {
            iVar11 = strncmp((char *)pcVar13,"CACHE{",6);
            pcVar15 = (cmState *)CONCAT44(extraout_var_02,iVar11);
            if (iVar11 != 0) {
              bVar7 = cmsys::RegularExpression::find(local_278,(char *)pcVar13);
              pcVar15 = (cmState *)CONCAT71(extraout_var,bVar7);
              if (bVar7) {
                local_3d0._0_8_ = local_3d0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d0,pcVar13,
                           (undefined1 *)
                           ((long)pcVar13 +
                           ((long)(this->cmNamedCurly).endp[0] -
                           (long)(this->cmNamedCurly).searchstring)));
                plVar16 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_3d0,0,(char *)0x0,0x4d0080);
                local_3a8._0_8_ = local_3a8 + 0x10;
                puVar20 = (ulong *)(plVar16 + 2);
                if ((ulong *)*plVar16 == puVar20) {
                  local_3a8._16_8_ = *puVar20;
                  local_3a8._24_8_ = plVar16[3];
                }
                else {
                  local_3a8._16_8_ = *puVar20;
                  local_3a8._0_8_ = (ulong *)*plVar16;
                }
                local_3a8._8_8_ = plVar16[1];
                *plVar16 = (long)puVar20;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                plVar16 = (long *)std::__cxx11::string::append(local_3a8);
                pcVar15 = (cmState *)(plVar16 + 2);
                if ((cmState *)*plVar16 == pcVar15) {
                  local_1b8._0_8_ = *(undefined8 *)&(pcVar15->PropertyDefinitions)._M_t._M_impl;
                  local_1b8._8_8_ = plVar16[3];
                  local_1c8._0_8_ = (cmState *)local_1b8;
                }
                else {
                  local_1b8._0_8_ = *(undefined8 *)&(pcVar15->PropertyDefinitions)._M_t._M_impl;
                  local_1c8._0_8_ = (cmState *)*plVar16;
                }
                local_1c8._8_8_ = plVar16[1];
                *plVar16 = (long)pcVar15;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                std::__cxx11::string::operator=((string *)errorstr,(string *)local_1c8);
                if ((cmState *)local_1c8._0_8_ != (cmState *)local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
                }
                if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                  operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
                }
                pcVar15 = (cmState *)(local_3d0 + 0x10);
                if ((cmState *)local_3d0._0_8_ != pcVar15) {
                  operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
                  pcVar15 = extraout_RAX_02;
                }
                pcVar15 = (cmState *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
                local_3d4 = FATAL_ERROR;
                local_360 = pcVar15;
              }
              goto LAB_0036c5bb;
            }
            pcVar23 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x7;
            local_338 = (cmState *)CONCAT44(local_338._4_4_,2);
            pcVar13 = pcVar21;
          }
        }
        if (pcVar23 != (cmState *)0x0) {
          std::__cxx11::string::append((char *)&local_358,(ulong)pcVar13);
          pcVar22 = (cmState *)&pcVar23[-1].field_0x187;
          pcStack_330 = local_350;
          pcVar13 = pcVar23;
          if (local_308._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (_Elt_pointer)
              &((_Base_ptr)
               ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_last + -0x20))->_M_left)
          {
            std::deque<t_lookup,std::allocator<t_lookup>>::_M_push_back_aux<t_lookup_const&>
                      ((deque<t_lookup,std::allocator<t_lookup>> *)&local_308,
                       (t_lookup *)(local_348 + 0x10));
            pcVar15 = extraout_RAX_03;
          }
          else {
            *(cmState **)
             &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                 *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t).
              _M_impl = local_338;
            *(cmLinkedTree<cmState::SnapshotDataType> **)
             &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                 *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t).
              _M_impl.super__Rb_tree_header._M_header = local_350;
            pcVar15 = (cmState *)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_308._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 (_Elt_pointer)
                 &(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                     *)&(local_308._M_impl.super__Deque_impl_data._M_finish._M_cur)->domain)->_M_t).
                  _M_impl.super__Rb_tree_header._M_header._M_parent;
          }
        }
      }
    }
    else if (bVar2 == 0x40) {
      if (replaceAt) {
        puVar1 = &(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
        pcVar13 = (cmState *)strchr(puVar1,0x40);
        pcVar15 = (cmState *)CONCAT71((int7)((ulong)pcVar13 >> 8),pcVar13 == (cmState *)0x0);
        bVar7 = true;
        if (pcVar13 != (cmState *)puVar1 && pcVar13 != (cmState *)0x0) {
          sVar18 = strspn(puVar1,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
          pcVar15 = (cmState *)(puVar1 + sVar18);
          if (pcVar13 == pcVar15) {
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,puVar1,puVar1 + ~(ulong)pcVar22 + (long)pcVar13);
            pcVar14 = GetDefinition(this,(string *)local_1c8);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "";
            }
            std::__cxx11::string::string((string *)local_3a8,pcVar14,(allocator *)local_3d0);
            if (local_328[0x14] != '\0') {
              cmSystemTools::EscapeQuotes((string *)local_3d0,(string *)local_3a8);
              std::__cxx11::string::operator=((string *)local_3a8,(string *)local_3d0);
              if ((cmState *)local_3d0._0_8_ != (cmState *)(local_3d0 + 0x10)) {
                operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
              }
            }
            std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
            std::__cxx11::string::_M_append((char *)&local_358,local_3a8._0_8_);
            if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
              operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
            }
            pcVar15 = (cmState *)local_1b8;
            if ((cmState *)local_1c8._0_8_ != pcVar15) {
              operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
              pcVar15 = extraout_RAX;
            }
            pcVar21 = (cmState *)&(pcVar13->PropertyDefinitions)._M_t._M_impl.field_0x1;
            bVar7 = false;
            pcVar22 = pcVar13;
          }
        }
        pcVar13 = pcVar21;
        if (!bVar7) goto LAB_0036c639;
      }
LAB_0036bbfe:
      pcVar15 = (cmState *)
                ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first >> 4);
      pcVar13 = pcVar21;
      if ((char *)0x1 <
          (char *)((long)pcVar15 +
                  ((((ulong)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node -
                            (long)local_308._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                   1) + (ulong)((_Base_ptr)
                                local_308._M_impl.super__Deque_impl_data._M_finish._M_node ==
                               (_Base_ptr)0x0)) * 0x20 +
                  ((long)local_308._M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)local_308._M_impl.super__Deque_impl_data._M_start._M_cur >> 4))) {
        iVar11 = isalnum((int)(char)bVar2);
        pcVar15 = (cmState *)CONCAT44(extraout_var_00,iVar11);
        if ((iVar11 == 0) &&
           ((uVar10 = bVar2 - 0x2b, 0x34 < uVar10 ||
            (pcVar15 = (cmState *)(ulong)uVar10,
            (0x1000000000001dU >> ((ulong)uVar10 & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::append((char *)errorstr);
          std::__cxx11::string::push_back((char)errorstr);
          std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          std::__cxx11::string::substr((ulong)local_3d0,(ulong)&local_358);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)local_3d0,0,(char *)0x0,0x4d0155);
          local_3a8._0_8_ = local_3a8 + 0x10;
          puVar20 = (ulong *)(plVar16 + 2);
          if ((ulong *)*plVar16 == puVar20) {
            local_3a8._16_8_ = *puVar20;
            local_3a8._24_8_ = plVar16[3];
          }
          else {
            local_3a8._16_8_ = *puVar20;
            local_3a8._0_8_ = (ulong *)*plVar16;
          }
          local_3a8._8_8_ = plVar16[1];
          *plVar16 = (long)puVar20;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          plVar16 = (long *)std::__cxx11::string::append(local_3a8);
          local_1c8._0_8_ = local_1b8;
          pcVar15 = (cmState *)(plVar16 + 2);
          if ((cmState *)*plVar16 == pcVar15) {
            local_1b8._0_8_ = *(undefined8 *)&(pcVar15->PropertyDefinitions)._M_t._M_impl;
            local_1b8._8_8_ = plVar16[3];
          }
          else {
            local_1b8._0_8_ = *(undefined8 *)&(pcVar15->PropertyDefinitions)._M_t._M_impl;
            local_1c8._0_8_ = (cmState *)*plVar16;
          }
          local_1c8._8_8_ = plVar16[1];
          *plVar16 = (long)pcVar15;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          std::__cxx11::string::_M_append((char *)errorstr,local_1c8._0_8_);
          if ((cmState *)local_1c8._0_8_ != (cmState *)local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
          if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
            operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
          }
          pcVar15 = (cmState *)(local_3d0 + 0x10);
          if ((cmState *)local_3d0._0_8_ != pcVar15) {
            operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
            pcVar15 = extraout_RAX_01;
          }
          local_360 = (cmState *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
          local_3d4 = FATAL_ERROR;
          pcVar15 = local_360;
        }
      }
    }
    else if (bVar2 == 0x5c) {
LAB_0036ba0b:
      if ((char)local_2b4 != '\0') goto LAB_0036c639;
      puVar1 = &(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
      bVar2 = (pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
      if (bVar2 < 0x72) {
        if (bVar2 == 0x3b) {
          pcVar15 = (cmState *)
                    ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first >> 4);
          if ((char *)((long)pcVar15 +
                      ((((ulong)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node -
                                (long)local_308._M_impl.super__Deque_impl_data._M_start._M_node) >>
                        3) - 1) +
                      (ulong)((_Base_ptr)local_308._M_impl.super__Deque_impl_data._M_finish._M_node
                             == (_Base_ptr)0x0)) * 0x20 +
                      ((long)local_308._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)local_308._M_impl.super__Deque_impl_data._M_start._M_cur >> 4)) ==
              (char *)0x1) goto LAB_0036bf3a;
        }
        else if (bVar2 == 0x6e) {
          std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)&local_358);
          goto LAB_0036bf36;
        }
LAB_0036bed4:
        iVar11 = isalnum((int)(char)bVar2);
        if ((bVar2 == 0) || (iVar11 != 0)) {
          uVar17 = std::__cxx11::string::append((char *)errorstr);
          if (bVar2 != 0) {
            uVar17 = std::__cxx11::string::push_back((char)errorstr);
          }
          local_360 = (cmState *)CONCAT71((int7)((ulong)uVar17 >> 8),1);
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)errorstr);
        }
        else {
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          pcVar21 = (cmState *)puVar1;
        }
      }
      else {
        if (bVar2 == 0x72) {
          std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)&local_358);
        }
        else {
          if (bVar2 != 0x74) goto LAB_0036bed4;
          std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
          pcVar15 = (cmState *)std::__cxx11::string::append((char *)&local_358);
        }
LAB_0036bf36:
        pcVar21 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x2;
      }
LAB_0036bf3a:
      pcVar13 = pcVar21;
      if (*(char *)&(pcVar21->PropertyDefinitions)._M_t._M_impl != '\0') {
        pcVar22 = (cmState *)puVar1;
      }
    }
    else {
      if (bVar2 != 0x7d) goto LAB_0036bbfe;
      pcVar15 = (cmState *)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (((long)local_308._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_308._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          ((((ulong)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_308._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)((_Base_ptr)local_308._M_impl.super__Deque_impl_data._M_finish._M_node ==
                 (_Base_ptr)0x0)) * 0x20 < 2) goto LAB_0036c639;
      if (local_308._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_308._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pcVar15 = (cmState *)
                  (((_Base_ptr)
                   ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node + -0x20))->
                   _M_right + 0x10);
      }
      iVar11 = *(int *)((long)&pcVar15[-1].BinaryDirectory.field_2 + 8);
      uVar4 = *(ulong *)&pcVar15[-1].IsInTryCompile;
      if (local_308._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_308._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_308._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_308._M_impl.super__Deque_impl_data._M_finish._M_first =
             (_Elt_pointer)
             ((_Base_ptr)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node + -0x20))
             ->_M_right;
        local_308._M_impl.super__Deque_impl_data._M_finish._M_last =
             (_Elt_pointer)
             &((cmState *)
              ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first + 0x188))->
              GlobalProperties;
        local_308._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             &(((cmState *)
               ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first + 0x188))->
              Commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        local_308._M_impl.super__Deque_impl_data._M_finish._M_node =
             (_Map_pointer)
             &((_Base_ptr)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node + -0x20)
              )->_M_right;
      }
      else {
        local_308._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             ((long)&(((cmState *)
                      ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur + -0x188))->
                     BinaryDirectory).field_2 + 8);
      }
      std::__cxx11::string::append((char *)&local_358,(ulong)pcVar21);
      std::__cxx11::string::substr((ulong)local_3d0,(ulong)&local_358);
      local_338 = (cmState *)local_328;
      pcStack_330 = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
      local_328[0] = 0;
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar12 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                        ::lineVar_abi_cxx11_), iVar12 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (iVar11 == 0) {
        if (((filename == (char *)0x0) ||
            (local_3d0._8_8_ !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_3d0._8_8_ != 0 &&
            (iVar11 = bcmp((void *)local_3d0._0_8_,
                           ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                           ::lineVar_abi_cxx11_._M_dataplus._M_p,local_3d0._8_8_), iVar11 != 0)))) {
          pcVar14 = GetDefinition(this,(string *)local_3d0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::ostream::_M_insert<long>((long)local_1c8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)(local_348 + 0x10),(string *)local_3a8);
          if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
            operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x60));
LAB_0036c17f:
          pcVar14 = (char *)0x0;
        }
      }
      else if (iVar11 == 1) {
        pcVar14 = cmsys::SystemTools::GetEnv((char *)local_3d0._0_8_);
      }
      else {
        if (iVar11 != 2) goto LAB_0036c17f;
        pcVar14 = cmState::GetCacheEntryValue(local_270,(string *)local_3d0);
      }
      pcVar6 = pcStack_330;
      if (pcVar14 == (char *)0x0) {
        if ((!removeEmpty) &&
           (this->LocalGenerator->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) {
          local_1c8._0_8_ = (this->Internal).x_;
          local_3a8._0_8_ =
               *(undefined8 *)&(((cmState *)local_1c8._0_8_)->PropertyDefinitions)._M_t._M_impl;
          bVar7 = cmDefinitions::HasKey
                            ((string *)local_3d0,(StackConstIter *)local_1c8,
                             (StackConstIter *)local_3a8);
          if (!bVar7) {
            bVar7 = this->CheckSystemVars;
            bVar9 = true;
            if (bVar7 == false) {
              std::__cxx11::string::string((string *)local_248,filename,&local_3a9);
              pcVar14 = cmake::GetHomeDirectory
                                  (this->LocalGenerator->GlobalGenerator->CMakeInstance);
              std::__cxx11::string::string((string *)local_1e8._M_local_buf,pcVar14,&local_3aa);
              bVar8 = cmsys::SystemTools::IsSubDirectory((string *)local_248,(string *)&local_1e8);
              if (bVar8) goto LAB_0036c307;
              std::__cxx11::string::string((string *)local_268,filename,&local_3ab);
              pcVar14 = cmake::GetHomeOutputDirectory
                                  (this->LocalGenerator->GlobalGenerator->CMakeInstance);
              std::__cxx11::string::string((string *)local_208,pcVar14,&local_3ac);
              bVar9 = cmsys::SystemTools::IsSubDirectory((string *)local_268,(string *)local_208);
              bVar8 = true;
            }
            else {
LAB_0036c307:
              bVar8 = false;
            }
            if (bVar8) {
              if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
                operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
              }
              if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
                operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
              }
            }
            if (bVar7 == false) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_allocated_capacity != &local_1d8) {
                operator_delete((void *)local_1e8._M_allocated_capacity,
                                local_1d8._M_allocated_capacity + 1);
              }
              if ((pointer)local_248._0_8_ != (pointer)((long)local_248 + 0x10U)) {
                operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
              }
            }
            if (bVar9 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              local_3a8._0_8_ = local_3a8 + 0x10;
              local_3a8._8_8_ = 0;
              local_3a8._16_8_ = local_3a8._16_8_ & 0xffffffffffffff00;
              local_388._M_p = (pointer)&local_378;
              local_380 = 0;
              local_378._M_local_buf[0] = '\0';
              local_368 = (_Base_ptr)0x0;
              cmOutputConverter::cmOutputConverter
                        (&local_50,
                         (Snapshot)
                         (local_280->Generators).
                         super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                         ._M_impl.super__Vector_impl_data);
              std::__cxx11::string::string((string *)local_228._M_local_buf,filename,&local_3ad);
              cmOutputConverter::Convert
                        ((string *)local_2a0,&local_50,(string *)&local_228,HOME,UNCHANGED);
              std::__cxx11::string::operator=((string *)&local_388,(string *)local_2a0);
              if ((_Base_ptr)local_2a0._0_8_ != (_Base_ptr)(local_2a0 + 0x10)) {
                operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
              }
              if ((pointer *)local_228._M_allocated_capacity != local_218) {
                operator_delete((void *)local_228._M_allocated_capacity,
                                (ulong)((long)&(local_218[0]->_M_dataplus)._M_p + 1));
              }
              local_368 = (_Base_ptr)local_328._24_8_;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"uninitialized variable \'",0x18);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1c8,(char *)local_3d0._0_8_,local_3d0._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\'",1);
              this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
              std::__cxx11::stringbuf::str();
              cmake::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_2a0,
                                  (cmListFileContext *)local_3a8);
              if ((_Base_ptr)local_2a0._0_8_ != (_Base_ptr)(local_2a0 + 0x10)) {
                operator_delete((void *)local_2a0._0_8_,(ulong)(local_2a0._16_8_ + 1));
              }
              cmListFileContext::~cmListFileContext((cmListFileContext *)local_3a8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x60));
            }
          }
        }
      }
      else if (local_328[0x14] == '\0') {
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)(local_348 + 0x10),0,(char *)pcVar6,(ulong)pcVar14);
      }
      else {
        local_3a8._0_8_ = local_3a8 + 0x10;
        sVar18 = strlen(pcVar14);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3a8,pcVar14,pcVar14 + sVar18);
        cmSystemTools::EscapeQuotes((string *)local_1c8,(string *)local_3a8);
        std::__cxx11::string::operator=((string *)(local_348 + 0x10),(string *)local_1c8);
        if ((cmState *)local_1c8._0_8_ != (cmState *)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
        }
        if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
          operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
        }
      }
      std::__cxx11::string::replace
                ((ulong)&local_358,uVar4,(char *)((long)local_350 - uVar4),(ulong)local_338);
      if (local_338 != (cmState *)local_328) {
        operator_delete(local_338,CONCAT71(local_328._1_7_,local_328[0]) + 1);
      }
      pcVar15 = (cmState *)(local_3d0 + 0x10);
      if ((cmState *)local_3d0._0_8_ != pcVar15) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        pcVar15 = extraout_RAX_00;
      }
      pcVar13 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1;
    }
LAB_0036c639:
    if (((ulong)local_360 & 1) != 0) goto LAB_0036ca4b;
  } while ((((ulong)local_2a8 & 1) == 0) &&
          (pmVar5 = &pcVar22->PropertyDefinitions,
          pcVar22 = (cmState *)&(pcVar22->PropertyDefinitions)._M_t._M_impl.field_0x1,
          pcVar21 = pcVar13, (pmVar5->_M_t)._M_impl.field_0x1 != '\0'));
  if (((long)local_308._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_308._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_308._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)((_Base_ptr)local_308._M_impl.super__Deque_impl_data._M_finish._M_node ==
             (_Base_ptr)0x0)) * 0x20 != 1) {
    local_360 = (cmState *)
                CONCAT71((int7)((long)local_308._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)local_308._M_impl.super__Deque_impl_data._M_finish._M_first >>
                               0xc),1);
    std::__cxx11::string::append((char *)errorstr);
  }
LAB_0036ca4b:
  if (((ulong)local_360 & 1) == 0) {
    std::__cxx11::string::append((char *)&local_358);
    std::__cxx11::string::_M_assign((string *)local_2b0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
      sVar18 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,filename,sVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      poVar19 = std::ostream::_M_insert<long>((long)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(local_2b0->_M_dataplus)._M_p,
                         local_2b0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,(errorstr->_M_dataplus)._M_p,errorstr->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)errorstr,(string *)local_3a8);
    if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x60));
    local_3d4 = FATAL_ERROR;
  }
  std::_Deque_base<t_lookup,_std::allocator<t_lookup>_>::~_Deque_base(&local_308);
  if (local_358 != (_Base_ptr)local_348) {
    operator_delete(local_358,CONCAT71(local_348._1_7_,local_348[0]) + 1);
  }
  return local_3d4;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::stack<t_lookup> openstack;
  bool error = false;
  bool done = false;
  openstack.push(t_lookup());
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(openstack.size() > 1)
          {
          t_lookup var = openstack.top();
          openstack.pop();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.size() == 1)
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(openstack.size() > 1 &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.top().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && openstack.size() != 1)
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}